

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddBlindTxOutData(void *handle,void *blind_handle,uint32_t index,char *confidential_key)

{
  CfdException *pCVar1;
  allocator local_b9;
  string local_b8;
  TxOutBlindKeys params;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&params,"BlindTxData",(allocator *)&local_b8);
  cfd::capi::CheckBuffer(blind_handle,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  if (*(long *)((long)blind_handle + 0x18) == 0) {
    params._0_8_ = (long)
                   "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   + 0x56;
    params.confidential_key.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x4e0;
    params.confidential_key.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdAddBlindTxOutData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"buffer state is illegal.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. buffer state is illegal.",
               (allocator *)&local_b8);
    cfd::core::CfdException::CfdException(pCVar1,kCfdOutOfRangeError,(string *)&params);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (confidential_key != (char *)0x0) {
    cfd::api::TxOutBlindKeys::TxOutBlindKeys(&params);
    params.index = index;
    std::__cxx11::string::string((string *)&local_b8,confidential_key,&local_b9);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_40,&local_b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&params.confidential_key,
               &local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::__cxx11::string::~string((string *)&local_b8);
    std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::push_back
              (*(vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> **)
                ((long)blind_handle + 0x18),&params);
    cfd::api::TxOutBlindKeys::~TxOutBlindKeys(&params);
    return 0;
  }
  params._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 + 0x56;
  params.confidential_key.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x4e6;
  params.confidential_key.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = "CfdAddBlindTxOutData";
  cfd::core::logger::warn<>((CfdSourceLocation *)&params,"confidential key is null.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&params,"Failed to parameter. confidential key is null.",
             (allocator *)&local_b8);
  cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&params);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddBlindTxOutData(
    void* handle, void* blind_handle, uint32_t index,
    const char* confidential_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txout_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (confidential_key == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null.");
    }

    TxOutBlindKeys params;
    params.index = index;
    params.confidential_key = Pubkey(confidential_key);

    buffer->txout_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}